

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

ExpEmit __thiscall FxBoolCast::Emit(FxBoolCast *this,VMFunctionBuilder *build)

{
  int iVar1;
  ExpEmit EVar2;
  bool bVar3;
  int local_4c;
  ExpEmit local_28;
  ExpEmit from;
  VMFunctionBuilder *build_local;
  FxBoolCast *this_local;
  ExpEmit to;
  undefined4 extraout_var;
  
  from = (ExpEmit)build;
  EVar2._0_4_ = (*this->basex->_vptr_FxExpression[9])(this->basex,build);
  EVar2.Konst = (bool)(char)extraout_var;
  EVar2.Fixed = (bool)(char)((uint)extraout_var >> 8);
  EVar2.Final = (bool)(char)((uint)extraout_var >> 0x10);
  EVar2.Target = (bool)(char)((uint)extraout_var >> 0x18);
  local_28.Konst = SUB41(extraout_var,0);
  local_28 = EVar2;
  if (((local_28.Konst ^ 0xffU) & 1) == 0) {
    __assert_fail("!from.Konst",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                  ,0x327,"virtual ExpEmit FxBoolCast::Emit(VMFunctionBuilder *)");
  }
  iVar1 = PType::GetRegType(this->basex->ValueType);
  bVar3 = true;
  if (iVar1 != 0) {
    iVar1 = PType::GetRegType(this->basex->ValueType);
    bVar3 = true;
    if (iVar1 != 1) {
      iVar1 = PType::GetRegType(this->basex->ValueType);
      bVar3 = iVar1 == 3;
    }
  }
  if (bVar3) {
    if ((this->NeedValue & 1U) == 0) {
      this_local = (FxBoolCast *)local_28;
    }
    else {
      ExpEmit::ExpEmit((ExpEmit *)&this_local,(VMFunctionBuilder *)from,0,1);
      ExpEmit::Free(&local_28,(VMFunctionBuilder *)from);
      if (local_28.RegType == '\0') {
        local_4c = 0x14;
      }
      else {
        local_4c = 0x16;
        if (local_28.RegType == '\x01') {
          local_4c = 0x15;
        }
      }
      VMFunctionBuilder::Emit
                ((VMFunctionBuilder *)from,0x3f,(uint)(ushort)this_local,(uint)local_28.RegNum,
                 local_4c);
    }
    return (ExpEmit)this_local;
  }
  __assert_fail("basex->ValueType->GetRegType() == REGT_INT || basex->ValueType->GetRegType() == REGT_FLOAT || basex->ValueType->GetRegType() == REGT_POINTER"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/codegeneration/codegen.cpp"
                ,0x328,"virtual ExpEmit FxBoolCast::Emit(VMFunctionBuilder *)");
}

Assistant:

ExpEmit FxBoolCast::Emit(VMFunctionBuilder *build)
{
	ExpEmit from = basex->Emit(build);
	assert(!from.Konst);
	assert(basex->ValueType->GetRegType() == REGT_INT || basex->ValueType->GetRegType() == REGT_FLOAT || basex->ValueType->GetRegType() == REGT_POINTER);

	if (NeedValue)
	{
		ExpEmit to(build, REGT_INT);
		from.Free(build);
		build->Emit(OP_CASTB, to.RegNum, from.RegNum, from.RegType == REGT_INT ? CASTB_I : from.RegType == REGT_FLOAT ? CASTB_F : CASTB_A);
		return to;
	}
	else
	{
		return from;
	}
}